

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_mul_restartable
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *R,mbedtls_mpi *m,mbedtls_ecp_point *P,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,mbedtls_ecp_restart_ctx *rs_ctx
              )

{
  mbedtls_mpi *X;
  mbedtls_mpi *Y;
  mbedtls_mpi *X_00;
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  mbedtls_ecp_group *Y_00;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  mbedtls_ecp_point *P_00;
  ulong uVar8;
  byte bVar9;
  uchar swap;
  size_t sVar10;
  mbedtls_ecp_point *pmVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  mbedtls_ecp_point *R_00;
  byte bVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  mbedtls_mpi AA;
  mbedtls_mpi BB;
  mbedtls_mpi B;
  mbedtls_mpi A;
  mbedtls_mpi DA;
  mbedtls_mpi E;
  mbedtls_ecp_point RP;
  mbedtls_mpi D;
  mbedtls_mpi C;
  ulong local_2b8;
  mbedtls_mpi local_298;
  void *local_280;
  _func_int_void_ptr_uchar_ptr_size_t *local_278;
  mbedtls_ecp_group *local_270;
  ulong local_268;
  mbedtls_ecp_point *local_260;
  uint local_254;
  mbedtls_mpi local_250;
  mbedtls_mpi local_238;
  mbedtls_ecp_point *local_220;
  mbedtls_ecp_point local_218;
  mbedtls_mpi local_1d0;
  mbedtls_mpi local_1b8;
  mbedtls_mpi local_1a0;
  mbedtls_ecp_point local_188 [3];
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  iVar4 = mbedtls_ecp_check_privkey(grp,m);
  if (iVar4 != 0) {
    return iVar4;
  }
  local_278 = f_rng;
  local_270 = (mbedtls_ecp_group *)m;
  iVar4 = mbedtls_ecp_check_pubkey(grp,P);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = -0x4f80;
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0)) {
    local_280 = p_rng;
    mbedtls_mpi_init(&local_188[0].X);
    mbedtls_mpi_init(&local_188[0].Y);
    mbedtls_mpi_init(&local_188[0].Z);
    mbedtls_mpi_init(&local_48);
    iVar4 = mbedtls_mpi_copy(&local_48,&P->X);
    if ((iVar4 == 0) &&
       ((iVar4 = mbedtls_ecp_copy(local_188,P), iVar4 == 0 &&
        (iVar4 = mbedtls_mpi_lset(&R->X,1), iVar4 == 0)))) {
      X = &R->Z;
      iVar4 = mbedtls_mpi_lset(X,0);
      if (iVar4 == 0) {
        mbedtls_mpi_free(&R->Y);
        Y = &grp->P;
        do {
          iVar4 = mbedtls_mpi_cmp_mpi(&local_188[0].X,Y);
          if (iVar4 < 0) {
            if ((local_278 == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
               (iVar4 = ecp_randomize_mxz(grp,local_188,local_278,local_280), iVar4 == 0)) {
              sVar10 = mbedtls_mpi_bitlen((mbedtls_mpi *)local_270);
              local_260 = (mbedtls_ecp_point *)&grp->A;
              goto LAB_0011c553;
            }
            break;
          }
          iVar4 = mbedtls_mpi_sub_abs(&local_188[0].X,&local_188[0].X,Y);
        } while (iVar4 == 0);
      }
    }
LAB_0011c4f4:
    mbedtls_mpi_free(&local_188[0].X);
    mbedtls_mpi_free(&local_188[0].Y);
    mbedtls_mpi_free(&local_188[0].Z);
    mbedtls_mpi_free(&local_48);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = 0;
    p_rng = local_280;
  }
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    return iVar4;
  }
  if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
    return iVar4;
  }
  iVar4 = mbedtls_mpi_cmp_mpi(&P->Y,&(grp->G).Y);
  local_280 = p_rng;
  if (iVar4 == 0) {
    iVar4 = mbedtls_mpi_cmp_mpi(&P->X,&(grp->G).X);
    bVar19 = iVar4 == 0;
  }
  else {
    bVar19 = false;
  }
  uVar8 = grp->nbits;
  bVar9 = (bVar19 + '\x01') - (uVar8 < 0x180) | 4;
  uVar5 = 2;
  if (bVar9 < uVar8) {
    uVar5 = (uint)bVar9;
  }
  uVar14 = (ulong)uVar5;
  uVar16 = 1 << ((byte)(uVar5 - 1) & 0x1f);
  local_268 = (uVar8 + uVar14) - 1;
  local_2b8 = local_268 / uVar14;
  if ((bVar19 == false) || (P_00 = grp->T, P_00 == (mbedtls_ecp_point *)0x0)) {
    uVar6 = uVar16 & 0xff;
    P_00 = (mbedtls_ecp_point *)calloc((ulong)uVar6,0x48);
    if (P_00 == (mbedtls_ecp_point *)0x0) {
      iVar4 = -0x4d80;
      P_00 = (mbedtls_ecp_point *)0x0;
      goto LAB_0011c13e;
    }
    uVar8 = (ulong)(uVar6 + (uVar6 == 0));
    pmVar11 = P_00;
    do {
      mbedtls_mpi_init(&pmVar11->X);
      mbedtls_mpi_init(&pmVar11->Y);
      mbedtls_mpi_init(&pmVar11->Z);
      pmVar11 = pmVar11 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  bVar9 = (byte)uVar16;
  if (bVar3) {
    iVar4 = mbedtls_ecp_copy(P_00,P);
    if (iVar4 == 0) {
      lVar17 = (uVar5 - 1) * local_2b8;
      if (lVar17 != 0) {
        uVar8 = 0;
        do {
          uVar5 = 1 << ((byte)(uVar8 / local_2b8) & 0x1f) & 0xff;
          pmVar11 = P_00 + uVar5;
          if (((uVar8 % local_2b8 == 0) &&
              (iVar4 = mbedtls_ecp_copy(pmVar11,P_00 + (uVar5 >> 1)), iVar4 != 0)) ||
             (iVar4 = ecp_double_jac(grp,pmVar11,pmVar11), iVar4 != 0)) goto LAB_0011bec8;
          uVar8 = uVar8 + 1;
        } while (lVar17 - uVar8 != 0);
      }
      uVar5 = uVar16 & 0xff;
      if (uVar5 < 2) {
        sVar10 = 0;
      }
      else {
        uVar6 = 1;
        sVar10 = 0;
        do {
          *(mbedtls_ecp_point **)(&local_188[0].X.s + sVar10 * 2) = P_00 + uVar6;
          sVar10 = sVar10 + 1;
          uVar6 = uVar6 * 2 & 0xff;
        } while (uVar6 < uVar5);
      }
      iVar4 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)local_188,sVar10);
      if (iVar4 == 0) {
        local_254 = uVar5;
        if (1 < uVar5) {
          bVar13 = 1;
          do {
            lVar17 = (ulong)bVar13 + 1;
            local_220 = P_00 + bVar13;
            pmVar11 = P_00 + ((ulong)bVar13 - 1);
            R_00 = (mbedtls_ecp_point *)((long)&P_00[-1].X.s + (ulong)((uint)bVar13 * 0x90));
            while (lVar17 = lVar17 + -1, lVar17 != 0) {
              local_260 = pmVar11 + -1;
              iVar4 = ecp_add_mixed(grp,R_00,pmVar11,local_220);
              pmVar11 = local_260;
              R_00 = R_00 + -1;
              if (iVar4 != 0) goto LAB_0011bec8;
            }
            bVar13 = bVar13 * '\x02';
          } while (bVar13 < bVar9);
        }
        if (local_254 < 2) {
          sVar10 = 0;
        }
        else {
          sVar10 = 0;
          pmVar11 = P_00;
          do {
            pmVar11 = pmVar11 + 1;
            *(mbedtls_ecp_point **)(&local_188[0].X.s + sVar10 * 2) = pmVar11;
            sVar10 = sVar10 + 1;
          } while ((ulong)local_254 - 1 != sVar10);
        }
        iVar4 = ecp_normalize_jac_many(grp,(mbedtls_ecp_point **)local_188,sVar10);
      }
    }
LAB_0011bec8:
    if (iVar4 != 0) goto LAB_0011c13e;
    if (bVar19 != false) {
      grp->T = P_00;
      grp->T_size = (ulong)(uVar16 & 0xff);
    }
  }
  iVar4 = mbedtls_mpi_get_bit(&grp->N,0);
  if (iVar4 == 0) {
    iVar4 = -0x4f80;
  }
  else {
    mbedtls_mpi_init(&local_218.X);
    mbedtls_mpi_init(&local_298);
    Y_00 = local_270;
    iVar4 = mbedtls_mpi_get_bit((mbedtls_mpi *)local_270,0);
    bVar19 = iVar4 == 0;
    iVar4 = mbedtls_mpi_copy(&local_218.X,(mbedtls_mpi *)Y_00);
    if (((iVar4 == 0) &&
        (iVar4 = mbedtls_mpi_sub_mpi(&local_298,&grp->N,(mbedtls_mpi *)Y_00), iVar4 == 0)) &&
       (iVar4 = mbedtls_mpi_safe_cond_assign(&local_218.X,&local_298,bVar19), iVar4 == 0)) {
      iVar4 = 0;
      memset(local_188,0,local_2b8 + 1);
      if (uVar14 <= local_268) {
        uVar8 = 0;
        local_270 = grp;
        do {
          uVar18 = 0;
          do {
            iVar4 = mbedtls_mpi_get_bit(&local_218.X,uVar18 * local_2b8 + uVar8);
            pbVar1 = (byte *)((long)&local_188[0].X.s + uVar8);
            *pbVar1 = *pbVar1 | (byte)(iVar4 << ((byte)uVar18 & 0x1f));
            uVar18 = uVar18 + 1;
          } while (uVar14 != uVar18);
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_2b8);
        iVar4 = 0;
        uVar8 = 0;
        bVar13 = 0;
        do {
          bVar2 = *(byte *)((long)&local_188[0].X.s + uVar8 + 1);
          bVar15 = bVar2 ^ bVar13;
          bVar12 = (~bVar15 & 1) * (byte)local_188[0].X.s;
          bVar13 = bVar12 & bVar15 | bVar2 & bVar13;
          bVar12 = bVar15 ^ bVar12;
          *(byte *)((long)&local_188[0].X.s + uVar8 + 1) = bVar12;
          *(byte *)((long)&local_188[0].X.s + uVar8) = ~bVar15 << 7 | (byte)local_188[0].X.s;
          uVar8 = uVar8 + 1;
          grp = local_270;
          local_188[0].X.s._0_1_ = bVar12;
        } while (local_2b8 != uVar8);
      }
    }
    mbedtls_mpi_free(&local_298);
    mbedtls_mpi_free(&local_218.X);
  }
  if (iVar4 != 0) goto LAB_0011c13e;
  mbedtls_mpi_init(&local_218.X);
  mbedtls_mpi_init(&local_218.Y);
  mbedtls_mpi_init(&local_218.Z);
  iVar4 = ecp_select_comb(grp,R,P_00,bVar9,*(uchar *)((long)&local_188[0].X.s + local_2b8));
  if ((iVar4 == 0) && (iVar4 = mbedtls_mpi_lset(&R->Z,1), iVar4 == 0)) {
    if (local_278 == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      iVar4 = 0;
      if (uVar14 <= local_268) goto LAB_0011c43b;
    }
    else {
      iVar4 = ecp_randomize_jac(grp,R,local_278,local_280);
      if (uVar14 <= local_268 && iVar4 == 0) {
LAB_0011c43b:
        while (iVar4 = ecp_double_jac(grp,R,R), iVar4 == 0) {
          uVar8 = local_2b8 - 1;
          iVar4 = ecp_select_comb(grp,&local_218,P_00,bVar9,
                                  *(uchar *)((long)local_188 + (local_2b8 - 1)));
          if (((iVar4 != 0) || (iVar4 = ecp_add_mixed(grp,R,R,&local_218), iVar4 != 0)) ||
             (local_2b8 = uVar8, uVar8 == 0)) break;
        }
      }
    }
  }
  mbedtls_mpi_free(&local_218.X);
  mbedtls_mpi_free(&local_218.Y);
  mbedtls_mpi_free(&local_218.Z);
  if (((iVar4 == 0) && (iVar4 = ecp_safe_invert_jac(grp,R,bVar19), iVar4 == 0)) &&
     ((local_278 == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
      (iVar4 = ecp_randomize_jac(grp,R,local_278,local_280), iVar4 == 0)))) {
    iVar4 = ecp_normalize_jac(grp,R);
  }
LAB_0011c13e:
  if ((P_00 != (mbedtls_ecp_point *)0x0) && (P_00 != grp->T)) {
    lVar17 = 0;
    do {
      mbedtls_ecp_point_free((mbedtls_ecp_point *)((long)&(P_00->X).s + lVar17));
      lVar17 = lVar17 + 0x48;
    } while ((ulong)((uVar16 & 0xff) + (uint)((uVar16 & 0xff) == 0)) * 0x48 != lVar17);
    free(P_00);
  }
  if (iVar4 != 0) {
    mbedtls_ecp_point_free(R);
  }
  return iVar4;
LAB_0011c553:
  bVar19 = sVar10 == 0;
  sVar10 = sVar10 - 1;
  if (bVar19) {
    if ((local_278 == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) ||
       (iVar4 = ecp_randomize_mxz(grp,R,local_278,local_280), iVar4 == 0)) {
      iVar4 = ecp_normalize_mxz(grp,R);
    }
    goto LAB_0011c4f4;
  }
  iVar4 = mbedtls_mpi_get_bit((mbedtls_mpi *)local_270,sVar10);
  swap = (uchar)iVar4;
  iVar4 = mbedtls_mpi_safe_cond_swap(&R->X,&local_188[0].X,swap);
  if ((iVar4 != 0) || (iVar4 = mbedtls_mpi_safe_cond_swap(X,&local_188[0].Z,swap), iVar4 != 0))
  goto LAB_0011c4f4;
  mbedtls_mpi_init(&local_218.X);
  mbedtls_mpi_init(&local_298);
  mbedtls_mpi_init(&local_238);
  mbedtls_mpi_init(&local_250);
  mbedtls_mpi_init(&local_1a0);
  mbedtls_mpi_init(&local_60);
  mbedtls_mpi_init(&local_78);
  mbedtls_mpi_init(&local_1b8);
  mbedtls_mpi_init(&local_1d0);
  iVar4 = mbedtls_mpi_add_mpi(&local_218.X,&R->X,X);
  if (iVar4 == 0) {
    do {
      iVar4 = mbedtls_mpi_cmp_mpi(&local_218.X,Y);
      if (iVar4 < 0) {
        iVar4 = 0;
        break;
      }
      iVar4 = mbedtls_mpi_sub_abs(&local_218.X,&local_218.X,Y);
    } while (iVar4 == 0);
  }
  if (iVar4 == 0) {
    iVar4 = mbedtls_mpi_mul_mpi(&local_298,&local_218.X,&local_218.X);
    if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_298,grp), iVar4 == 0)) {
      mul_count = mul_count + 1;
      iVar4 = 0;
    }
    if (iVar4 == 0) {
      iVar4 = mbedtls_mpi_sub_mpi(&local_238,&R->X,X);
      if (iVar4 == 0) {
        while (local_238.s < 0) {
          iVar4 = 0;
          iVar7 = mbedtls_mpi_cmp_int(&local_238,0);
          if ((iVar7 == 0) || (iVar4 = mbedtls_mpi_add_mpi(&local_238,&local_238,Y), iVar4 != 0))
          goto LAB_0011c6d2;
        }
        iVar4 = 0;
      }
LAB_0011c6d2:
      if (iVar4 == 0) {
        iVar4 = mbedtls_mpi_mul_mpi(&local_250,&local_238,&local_238);
        if ((iVar4 == 0) && (iVar4 = ecp_modp(&local_250,grp), iVar4 == 0)) {
          mul_count = mul_count + 1;
          iVar4 = 0;
        }
        if ((((((iVar4 == 0) &&
               (iVar4 = mbedtls_mpi_sub_mod(grp,&local_1a0,&local_298,&local_250), iVar4 == 0)) &&
              (iVar4 = mbedtls_mpi_add_mod(grp,&local_60,&local_188[0].X,&local_188[0].Z),
              iVar4 == 0)) &&
             ((iVar4 = mbedtls_mpi_sub_mod(grp,&local_78,&local_188[0].X,&local_188[0].Z),
              iVar4 == 0 &&
              (iVar4 = mbedtls_mpi_mul_mod(grp,&local_1b8,&local_78,&local_218.X), iVar4 == 0)))) &&
            (iVar4 = mbedtls_mpi_mul_mod(grp,&local_1d0,&local_60,&local_238), iVar4 == 0)) &&
           ((iVar4 = mbedtls_mpi_add_mpi(&local_188[0].X,&local_1b8,&local_1d0), iVar4 == 0 &&
            (iVar4 = ecp_modp(&local_188[0].X,grp), iVar4 == 0)))) {
          mul_count = mul_count + 1;
          iVar4 = mbedtls_mpi_mul_mod(grp,&local_188[0].X,&local_188[0].X,&local_188[0].X);
          if ((iVar4 == 0) &&
             (iVar4 = mbedtls_mpi_sub_mod(grp,&local_188[0].Z,&local_1b8,&local_1d0), iVar4 == 0)) {
            X_00 = &local_188[0].Z;
            iVar4 = mbedtls_mpi_mul_mod(grp,X_00,X_00,X_00);
            if ((((iVar4 == 0) &&
                 (iVar4 = mbedtls_mpi_mul_mod(grp,&local_188[0].Z,&local_48,&local_188[0].Z),
                 iVar4 == 0)) &&
                (iVar4 = mbedtls_mpi_mul_mod(grp,&R->X,&local_298,&local_250), iVar4 == 0)) &&
               ((iVar4 = mbedtls_mpi_mul_mod(grp,X,&local_260->X,&local_1a0), iVar4 == 0 &&
                (iVar4 = mbedtls_mpi_add_mod(grp,X,&local_250,X), iVar4 == 0)))) {
              iVar4 = mbedtls_mpi_mul_mod(grp,X,&local_1a0,X);
            }
          }
        }
      }
    }
  }
  mbedtls_mpi_free(&local_218.X);
  mbedtls_mpi_free(&local_298);
  mbedtls_mpi_free(&local_238);
  mbedtls_mpi_free(&local_250);
  mbedtls_mpi_free(&local_1a0);
  mbedtls_mpi_free(&local_60);
  mbedtls_mpi_free(&local_78);
  mbedtls_mpi_free(&local_1b8);
  mbedtls_mpi_free(&local_1d0);
  if (((iVar4 != 0) || (iVar4 = mbedtls_mpi_safe_cond_swap(&R->X,&local_188[0].X,swap), iVar4 != 0))
     || (iVar4 = mbedtls_mpi_safe_cond_swap(X,&local_188[0].Z,swap), iVar4 != 0)) goto LAB_0011c4f4;
  goto LAB_0011c553;
}

Assistant:

int mbedtls_ecp_mul_restartable( mbedtls_ecp_group *grp, mbedtls_ecp_point *R,
             const mbedtls_mpi *m, const mbedtls_ecp_point *P,
             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng,
             mbedtls_ecp_restart_ctx *rs_ctx )
{
    int ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    char is_grp_capable = 0;
#endif
    ECP_VALIDATE_RET( grp != NULL );
    ECP_VALIDATE_RET( R   != NULL );
    ECP_VALIDATE_RET( m   != NULL );
    ECP_VALIDATE_RET( P   != NULL );

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* reset ops count for this call if top-level */
    if( rs_ctx != NULL && rs_ctx->depth++ == 0 )
        rs_ctx->ops_done = 0;
#endif

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( ( is_grp_capable = mbedtls_internal_ecp_grp_capable( grp ) ) )
        MBEDTLS_MPI_CHK( mbedtls_internal_ecp_init( grp ) );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    /* skip argument check when restarting */
    if( rs_ctx == NULL || rs_ctx->rsm == NULL )
#endif
    {
        /* check_privkey is free */
        MBEDTLS_ECP_BUDGET( MBEDTLS_ECP_OPS_CHK );

        /* Common sanity checks */
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_privkey( grp, m ) );
        MBEDTLS_MPI_CHK( mbedtls_ecp_check_pubkey( grp, P ) );
    }

    ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
#if defined(ECP_MONTGOMERY)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_MONTGOMERY )
        MBEDTLS_MPI_CHK( ecp_mul_mxz( grp, R, m, P, f_rng, p_rng ) );
#endif
#if defined(ECP_SHORTWEIERSTRASS)
    if( mbedtls_ecp_get_type( grp ) == MBEDTLS_ECP_TYPE_SHORT_WEIERSTRASS )
        MBEDTLS_MPI_CHK( ecp_mul_comb( grp, R, m, P, f_rng, p_rng, rs_ctx ) );
#endif

cleanup:

#if defined(MBEDTLS_ECP_INTERNAL_ALT)
    if( is_grp_capable )
        mbedtls_internal_ecp_free( grp );
#endif /* MBEDTLS_ECP_INTERNAL_ALT */

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if( rs_ctx != NULL )
        rs_ctx->depth--;
#endif

    return( ret );
}